

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutTruth.c
# Opt level: O3

void Cut_TruthCompute(Cut_Man_t *p,Cut_Cut_t *pCut,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1,int fCompl0,
                     int fCompl1)

{
  uint *puVar1;
  uint *puVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  bVar7 = pCut->field_0x3 & 0xf;
  uVar6 = (ulong)(uint)(1 << (bVar7 - 5 & 0x1f));
  if (bVar7 < 6) {
    uVar6 = 1;
  }
  puVar1 = p->puTemp[0];
  lVar4 = (ulong)((byte)pCut0->field_0x3 & 0xf) * 4 + 0x14;
  if (fCompl0 == 0) {
    do {
      puVar1[uVar6 - 1] = *(uint *)((long)&pCut0->pNext + uVar6 * 4 + lVar4 + -0x10);
      bVar3 = 1 < uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar3);
  }
  else {
    do {
      puVar1[uVar6 - 1] = ~*(uint *)((long)&pCut0->pNext + uVar6 * 4 + lVar4 + -0x10);
      bVar3 = 1 < uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar3);
  }
  uVar8 = *(uint *)pCut;
  uVar9 = 0;
  if (0xfffffff < uVar8) {
    uVar6 = 0;
    uVar10 = 0;
    uVar9 = 0;
    do {
      if (uVar10 == *(uint *)pCut0 >> 0x1c) break;
      if (*(int *)(&pCut0[1].field_0x0 + (long)(int)uVar10 * 4) <=
          *(int *)(&pCut[1].field_0x0 + uVar6 * 4)) {
        if (*(int *)(&pCut[1].field_0x0 + uVar6 * 4) !=
            *(int *)(&pCut0[1].field_0x0 + (long)(int)uVar10 * 4)) goto LAB_004beacd;
        uVar9 = uVar9 | 1 << ((uint)uVar6 & 0x1f);
        uVar10 = uVar10 + 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar8 >> 0x1c != uVar6);
  }
  Extra_TruthStretch(p->puTemp[2],puVar1,*(uint *)pCut0 >> 0x1c,uVar8 >> 0x18 & 0xf,uVar9);
  bVar7 = pCut->field_0x3 & 0xf;
  uVar6 = (ulong)(uint)(1 << (bVar7 - 5 & 0x1f));
  if (bVar7 < 6) {
    uVar6 = 1;
  }
  puVar1 = p->puTemp[1];
  lVar4 = (ulong)((byte)pCut1->field_0x3 & 0xf) * 4 + 0x14;
  if (fCompl1 == 0) {
    do {
      puVar1[uVar6 - 1] = *(uint *)((long)&pCut1->pNext + uVar6 * 4 + lVar4 + -0x10);
      bVar3 = 1 < uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar3);
  }
  else {
    do {
      puVar1[uVar6 - 1] = ~*(uint *)((long)&pCut1->pNext + uVar6 * 4 + lVar4 + -0x10);
      bVar3 = 1 < uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar3);
  }
  uVar8 = *(uint *)pCut;
  uVar9 = 0;
  if (0xfffffff < uVar8) {
    uVar6 = 0;
    uVar10 = 0;
    uVar9 = 0;
    do {
      if (uVar10 == *(uint *)pCut1 >> 0x1c) break;
      if (*(int *)(&pCut1[1].field_0x0 + (long)(int)uVar10 * 4) <=
          *(int *)(&pCut[1].field_0x0 + uVar6 * 4)) {
        if (*(int *)(&pCut[1].field_0x0 + uVar6 * 4) !=
            *(int *)(&pCut1[1].field_0x0 + (long)(int)uVar10 * 4)) {
LAB_004beacd:
          __assert_fail("pCut->pLeaves[i] == pCut1->pLeaves[k]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutTruth.c"
                        ,0x42,"unsigned int Cut_TruthPhase(Cut_Cut_t *, Cut_Cut_t *)");
        }
        uVar9 = uVar9 | 1 << ((uint)uVar6 & 0x1f);
        uVar10 = uVar10 + 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar8 >> 0x1c != uVar6);
  }
  Extra_TruthStretch(p->puTemp[3],puVar1,*(uint *)pCut1 >> 0x1c,uVar8 >> 0x18 & 0xf,uVar9);
  uVar8 = *(uint *)pCut >> 0x18 & 0xf;
  uVar6 = (ulong)(uint)(1 << ((char)uVar8 - 5U & 0x1f));
  if (uVar8 < 6) {
    uVar6 = 1;
  }
  puVar1 = p->puTemp[2];
  puVar2 = p->puTemp[3];
  lVar4 = (ulong)uVar8 * 4 + 0x14;
  if ((*(uint *)pCut >> 0x17 & 1) == 0) {
    do {
      *(uint *)((long)&pCut->pNext + uVar6 * 4 + lVar4 + -0x10) =
           puVar2[uVar6 - 1] & puVar1[uVar6 - 1];
      bVar3 = 1 < uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar3);
  }
  else {
    do {
      *(uint *)((long)&pCut->pNext + uVar6 * 4 + lVar4 + -0x10) =
           ~(puVar2[uVar6 - 1] & puVar1[uVar6 - 1]);
      bVar3 = 1 < uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar3);
  }
  if ((p->pParams->fFancy != 0) &&
     (((undefined1  [24])*pCut & (undefined1  [24])0xf0000000) == (undefined1  [24])0x70000000)) {
    nTotal = nTotal + 1;
    uVar8 = (byte)pCut->field_0x3 & 0xf;
    iVar5 = Extra_TruthMinCofSuppOverlap
                      ((uint *)(&pCut[1].field_0x0 + (ulong)uVar8 * 4),uVar8,(int *)0x0);
    if (iVar5 < 5) {
      nGood = nGood + 1;
    }
  }
  return;
}

Assistant:

void Cut_TruthCompute( Cut_Man_t * p, Cut_Cut_t * pCut, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1, int fCompl0, int fCompl1 )
{
    // permute the first table
    if ( fCompl0 ) 
        Extra_TruthNot( p->puTemp[0], Cut_CutReadTruth(pCut0), pCut->nVarsMax );
    else
        Extra_TruthCopy( p->puTemp[0], Cut_CutReadTruth(pCut0), pCut->nVarsMax );
    Extra_TruthStretch( p->puTemp[2], p->puTemp[0], pCut0->nLeaves, pCut->nVarsMax, Cut_TruthPhase(pCut, pCut0) );
    // permute the second table
    if ( fCompl1 ) 
        Extra_TruthNot( p->puTemp[1], Cut_CutReadTruth(pCut1), pCut->nVarsMax );
    else
        Extra_TruthCopy( p->puTemp[1], Cut_CutReadTruth(pCut1), pCut->nVarsMax );
    Extra_TruthStretch( p->puTemp[3], p->puTemp[1], pCut1->nLeaves, pCut->nVarsMax, Cut_TruthPhase(pCut, pCut1) );
    // produce the resulting table
    if ( pCut->fCompl )
        Extra_TruthNand( Cut_CutReadTruth(pCut), p->puTemp[2], p->puTemp[3], pCut->nVarsMax );
    else
        Extra_TruthAnd( Cut_CutReadTruth(pCut), p->puTemp[2], p->puTemp[3], pCut->nVarsMax );

//    Ivy_TruthTestOne( *Cut_CutReadTruth(pCut) );

    // quit if no fancy computation is needed
    if ( !p->pParams->fFancy )
        return;

    if ( pCut->nLeaves != 7 )
        return;

    // count the total number of truth tables computed
    nTotal++;

    // MAPPING INTO ALTERA 6-2 LOGIC BLOCKS
    // call this procedure to find the minimum number of common variables in the cofactors
    // if this number is less or equal than 3, the cut can be implemented using the 6-2 logic block
    if ( Extra_TruthMinCofSuppOverlap( Cut_CutReadTruth(pCut), pCut->nVarsMax, NULL ) <= 4 )
        nGood++;

    // MAPPING INTO ACTEL 2x2 CELLS
    // call this procedure to see if a semi-canonical form can be found in the lookup table 
    // (if it exists, then a two-level 3-input LUT implementation of the cut exists)
    // Before this procedure is called, cell manager should be defined by calling
    // Cut_CellLoad (make sure file "cells22_daomap_iwls.txt" is available in the working dir)
//    if ( Cut_CellIsRunning() && pCut->nVarsMax <= 9 )
//        nGood += Cut_CellTruthLookup( Cut_CutReadTruth(pCut), pCut->nVarsMax );
}